

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandIndcut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fRefs;
  uint fBmc;
  uint fVerbose;
  uint fTarget;
  uint fStepUp;
  uint fVeryVerbose;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  undefined8 uVar3;
  undefined4 extraout_var_00;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 extraout_var;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_88 = 0;
  Extra_UtilGetoptReset();
  local_48 = 0x10;
  local_80 = 8;
  local_7c = 4;
  local_84 = 5000;
  local_8c = 1;
  local_50 = 1;
  fStepUp = 0;
  fBmc = 1;
  fRefs = 1;
  fTarget = 1;
  fVerbose = 0;
  fVeryVerbose = 0;
LAB_0026fbc8:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"FPCMLNBsbrtvwh"), iVar6 = globalUtilOptind,
        0x61 < iVar1) {
    switch(iVar1) {
    case 0x72:
      fRefs = fRefs ^ 1;
      break;
    case 0x73:
      fStepUp = fStepUp ^ 1;
      break;
    case 0x74:
      fTarget = fTarget ^ 1;
      break;
    case 0x75:
      goto switchD_0026fbed_caseD_44;
    case 0x76:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x77:
      fVeryVerbose = fVeryVerbose ^ 1;
      break;
    default:
      if (iVar1 != 0x62) goto switchD_0026fbed_caseD_44;
      fBmc = fBmc ^ 1;
    }
  }
  switch(iVar1) {
  case 0x42:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-B\" should be followed by an integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    uVar3 = CONCAT44(extraout_var,iVar1);
    local_50 = uVar3;
LAB_0026fd0a:
    uVar2 = (uint)uVar3;
joined_r0x0026fd7d:
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar2 < 0) {
switchD_0026fbed_caseD_44:
      Abc_Print(-2,"usage: indcut [-FPCMLNB num] [-sbrtvh]\n");
      Abc_Print(-2,"\t         K-step induction strengthened with cut properties\n");
      Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
                (ulong)local_8c);
      Abc_Print(-2,"\t-P num : number of time frames in the prefix (0=no prefix) [default = %d]\n",
                (ulong)local_88);
      Abc_Print(-2,"\t-C num : the max number of clauses to use for strengthening [default = %d]\n",
                (ulong)local_84);
      Abc_Print(-2,"\t-M num : the cut size (2 <= M <= 12) [default = %d]\n",(ulong)local_7c);
      Abc_Print(-2,"\t-L num : the max number of levels for cut computation [default = %d]\n",
                (ulong)local_80);
      Abc_Print(-2,"\t-N num : the max number of cuts to compute at a node [default = %d]\n",
                local_48);
      Abc_Print(-2,"\t-B num : the max number of invariant batches to try [default = %d]\n",local_50
               );
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (fStepUp == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle increment cut size in each batch [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (fBmc == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle enabling BMC check [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (fRefs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle enabling register clauses [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (fTarget == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle proving target / computing don\'t-cares [default = %s]\n",
                pcVar5);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_0026ff97:
      Abc_Print(iVar6,pcVar5);
      return 1;
    }
    goto LAB_0026fbc8;
  case 0x43:
    if (globalUtilOptind < argc) {
      local_84 = atoi(argv[globalUtilOptind]);
      uVar2 = local_84;
      goto joined_r0x0026fd7d;
    }
    pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
    break;
  case 0x44:
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4f:
    goto switchD_0026fbed_caseD_44;
  case 0x46:
    if (globalUtilOptind < argc) {
      local_8c = atoi(argv[globalUtilOptind]);
      uVar2 = local_8c;
      goto joined_r0x0026fd7d;
    }
    pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_80 = atoi(argv[globalUtilOptind]);
      uVar2 = local_80;
      goto joined_r0x0026fd7d;
    }
    pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      local_7c = atoi(argv[globalUtilOptind]);
      uVar2 = local_7c;
      goto joined_r0x0026fd7d;
    }
    pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      uVar3 = CONCAT44(extraout_var_00,iVar1);
      local_48 = uVar3;
      goto LAB_0026fd0a;
    }
    pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      local_88 = atoi(argv[globalUtilOptind]);
      uVar2 = local_88;
      goto joined_r0x0026fd7d;
    }
    pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  default:
    if (iVar1 == -1) {
      if (pNtk != (Abc_Ntk_t *)0x0) {
        if (pNtk->nObjCounts[8] == 0) {
          pcVar5 = "The network is combinational.\n";
        }
        else if (pNtk->ntkType == ABC_NTK_STRASH) {
          if (local_7c < 0xd) {
            Abc_NtkDarClau(pNtk,local_8c,local_88,local_84,local_7c,local_80,(int)local_48,
                           (int)local_50,fStepUp,fBmc,fRefs,fTarget,fVerbose,fVeryVerbose);
            return 0;
          }
          pcVar5 = "The cut size should be not exceed 12.\n";
        }
        else {
          pcVar5 = "Currently only works for structurally hashed circuits.\n";
        }
        Abc_Print(-1,pcVar5);
        return 0;
      }
      pcVar5 = "Empty network.\n";
      iVar6 = -1;
      goto LAB_0026ff97;
    }
    goto switchD_0026fbed_caseD_44;
  }
  Abc_Print(-1,pcVar5);
  goto switchD_0026fbed_caseD_44;
}

Assistant:

int Abc_CommandIndcut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int nFrames;
    int nPref;
    int nClauses;
    int nLutSize;
    int nLevels;
    int nCutsMax;
    int nBatches;
    int fStepUp;
    int fBmc;
    int fRegs;
    int fTarget;
    int fVerbose;
    int fVeryVerbose;
    int c;
    extern int Abc_NtkDarClau( Abc_Ntk_t * pNtk, int nFrames, int nPref, int nClauses, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fBmc, int fRegs, int fTarget, int fVerbose, int fVeryVerbose );
    // set defaults
    nFrames      =    1;
    nPref        =    0;
    nClauses     = 5000;
    nLutSize     =    4;
    nLevels      =    8;
    nCutsMax     =   16;
    nBatches     =    1;
    fStepUp      =    0;
    fBmc         =    1;
    fRegs        =    1;
    fTarget      =    1;
    fVerbose     =    0;
    fVeryVerbose =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FPCMLNBsbrtvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPref = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPref < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nClauses = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nClauses < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevels = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevels < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutsMax < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            nBatches = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBatches < 0 )
                goto usage;
            break;
        case 's':
            fStepUp ^= 1;
            break;
        case 'b':
            fBmc ^= 1;
            break;
        case 'r':
            fRegs ^= 1;
            break;
        case 't':
            fTarget ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( nLutSize > 12 )
    {
        Abc_Print( -1, "The cut size should be not exceed 12.\n" );
        return 0;
    }
    Abc_NtkDarClau( pNtk, nFrames, nPref, nClauses, nLutSize, nLevels, nCutsMax, nBatches, fStepUp, fBmc, fRegs, fTarget, fVerbose, fVeryVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: indcut [-FPCMLNB num] [-sbrtvh]\n" );
    Abc_Print( -2, "\t         K-step induction strengthened with cut properties\n" );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-P num : number of time frames in the prefix (0=no prefix) [default = %d]\n", nPref );
    Abc_Print( -2, "\t-C num : the max number of clauses to use for strengthening [default = %d]\n", nClauses );
    Abc_Print( -2, "\t-M num : the cut size (2 <= M <= 12) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-L num : the max number of levels for cut computation [default = %d]\n", nLevels );
    Abc_Print( -2, "\t-N num : the max number of cuts to compute at a node [default = %d]\n", nCutsMax );
    Abc_Print( -2, "\t-B num : the max number of invariant batches to try [default = %d]\n", nBatches );
    Abc_Print( -2, "\t-s     : toggle increment cut size in each batch [default = %s]\n", fStepUp? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle enabling BMC check [default = %s]\n", fBmc? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle enabling register clauses [default = %s]\n", fRegs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle proving target / computing don't-cares [default = %s]\n", fTarget? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-w     : toggle printing very verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}